

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

void __thiscall SimpleString::copyToBuffer(SimpleString *this,char *bufferToCopy,size_t bufferSize)

{
  char cVar1;
  char *pcVar2;
  size_t n;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  if (bufferSize != 0 && bufferToCopy != (char *)0x0) {
    pcVar2 = this->buffer_;
    uVar3 = 0xffffffffffffffff;
    do {
      lVar5 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (pcVar2[lVar5] != '\0');
    uVar4 = bufferSize - 1;
    if (uVar3 <= uVar4) {
      uVar3 = 0xffffffffffffffff;
      do {
        uVar4 = uVar3 + 1;
        lVar5 = uVar3 + 1;
        uVar3 = uVar4;
      } while (pcVar2[lVar5] != '\0');
    }
    if (uVar4 != 0) {
      lVar5 = 0;
      do {
        cVar1 = pcVar2[lVar5];
        bufferToCopy[lVar5] = cVar1;
        if (cVar1 == '\0') break;
        bVar6 = uVar4 - 1 != lVar5;
        lVar5 = lVar5 + 1;
      } while (bVar6);
    }
    bufferToCopy[uVar4] = '\0';
  }
  return;
}

Assistant:

void SimpleString::copyToBuffer(char* bufferToCopy, size_t bufferSize) const
{
    if (bufferToCopy == NULLPTR || bufferSize == 0) return;

    size_t sizeToCopy = (bufferSize-1 < size()) ? (bufferSize-1) : size();

    StrNCpy(bufferToCopy, getBuffer(), sizeToCopy);
    bufferToCopy[sizeToCopy] = '\0';
}